

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O1

int * __thiscall btHullTriangle::neib(btHullTriangle *this,int a,int b)

{
  int iVar1;
  undefined1 auVar2 [16];
  int iVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  int *in_R9;
  int *piVar7;
  long lVar8;
  
  piVar7 = &(this->n).z;
  uVar6 = 2;
  lVar8 = 0;
  do {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar6;
    if (lVar8 == 3) {
      return &neib::er;
    }
    iVar3 = (int)lVar8;
    uVar5 = (ulong)(iVar3 + 1);
    if (lVar8 == 2) {
      uVar5 = 0;
    }
    iVar1 = (&(this->super_int3).x)[lVar8];
    if ((iVar1 == a) && ((&(this->super_int3).x)[uVar5] == b)) {
      in_R9 = (int *)((long)piVar7 +
                     (SUB168(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffcU) * -3
                     );
LAB_00125bc6:
      bVar4 = false;
    }
    else {
      bVar4 = true;
      if ((iVar1 == b) && ((&(this->super_int3).x)[uVar5] == a)) {
        in_R9 = &(this->n).x + (((iVar3 + 2U) / 3) * -3 + iVar3 + 2);
        goto LAB_00125bc6;
      }
    }
    piVar7 = piVar7 + 1;
    uVar6 = uVar6 + 1;
    lVar8 = lVar8 + 1;
    if (!bVar4) {
      return in_R9;
    }
  } while( true );
}

Assistant:

int &btHullTriangle::neib(int a,int b)
{
	static int er=-1;
	int i;
	for(i=0;i<3;i++) 
	{
		int i1=(i+1)%3;
		int i2=(i+2)%3;
		if((*this)[i]==a && (*this)[i1]==b) return n[i2];
		if((*this)[i]==b && (*this)[i1]==a) return n[i2];
	}
	btAssert(0);
	return er;
}